

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::PhpNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  bool bVar1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  string_view name;
  
  name._M_str = (char *)classname._M_len;
  name._M_len = (size_t)name._M_str;
  bVar1 = IsReservedName((php *)this,name);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"PB","");
    return (string *)CONCAT71(extraout_var,extraout_AL);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return (string *)CONCAT71(extraout_var_00,extraout_AL_00);
}

Assistant:

std::string PhpNamePrefix(absl::string_view classname) {
  if (IsReservedName(classname)) return "PB";
  return "";
}